

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UBool __thiscall
icu_63::UnicodeString::padLeading(UnicodeString *this,int32_t targetLength,UChar padChar)

{
  UBool UVar1;
  int32_t count;
  char16_t *src;
  int local_34;
  int32_t start;
  UChar *array;
  int32_t oldLength;
  UChar padChar_local;
  int32_t targetLength_local;
  UnicodeString *this_local;
  
  count = length(this);
  if ((count < targetLength) &&
     (UVar1 = cloneArrayIfNeeded(this,targetLength,-1,'\x01',(int32_t **)0x0,'\0'), UVar1 != '\0'))
  {
    src = getArrayStart(this);
    local_34 = targetLength - count;
    us_arrayCopy(src,0,src,local_34,count);
    while (local_34 = local_34 + -1, -1 < local_34) {
      src[local_34] = padChar;
    }
    setLength(this,targetLength);
    return '\x01';
  }
  return '\0';
}

Assistant:

UBool 
UnicodeString::padLeading(int32_t targetLength,
                          UChar padChar)
{
  int32_t oldLength = length();
  if(oldLength >= targetLength || !cloneArrayIfNeeded(targetLength)) {
    return FALSE;
  } else {
    // move contents up by padding width
    UChar *array = getArrayStart();
    int32_t start = targetLength - oldLength;
    us_arrayCopy(array, 0, array, start, oldLength);

    // fill in padding character
    while(--start >= 0) {
      array[start] = padChar;
    }
    setLength(targetLength);
    return TRUE;
  }
}